

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O1

void __thiscall VDasher::lineTo(VDasher *this,VPointF *p)

{
  ulong uVar1;
  VPointF *p_00;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  VPointF local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float fStack_24;
  uint uStack_20;
  uint uStack_1c;
  
  fVar12 = (this->mCurPt).mx;
  fVar13 = (this->mCurPt).my;
  fVar8 = p->mx;
  fVar10 = p->my;
  fVar2 = fVar8 - fVar12;
  fVar4 = fVar10 - fVar13;
  auVar5._0_8_ = CONCAT44(fVar4,fVar2) ^ 0x8000000080000000;
  auVar5._8_4_ = 0x80000000;
  auVar5._12_4_ = 0x80000000;
  auVar6._4_4_ = fVar4;
  auVar6._0_4_ = fVar2;
  auVar6._8_8_ = 0;
  auVar6 = maxps(auVar5,auVar6);
  fVar2 = auVar6._0_4_;
  fVar4 = auVar6._4_4_;
  fVar2 = (float)(-(uint)(fVar4 < fVar2) & (uint)(fVar4 * 0.375 + fVar2) |
                 ~-(uint)(fVar4 < fVar2) & (uint)(fVar2 * 0.375 + fVar4));
  if (fVar2 <= this->mCurrentLength) {
    this->mCurrentLength = this->mCurrentLength - fVar2;
    p_00 = p;
  }
  else {
    fVar3 = this->mCurrentLength;
    if (fVar3 < fVar2) {
      fStack_30 = 0.0;
      fStack_2c = 0.0;
      local_48 = fVar12;
      fStack_44 = fVar13;
      fStack_40 = 0.0;
      fStack_3c = 0.0;
      local_28 = fVar2;
      fStack_24 = fVar4;
      uStack_20 = (uint)fVar4 | ~(uint)fVar4 & auVar6._8_4_;
      uStack_1c = (uint)fVar4 | ~(uint)fVar4 & auVar6._12_4_;
      local_38 = fVar8;
      fStack_34 = fVar10;
      do {
        local_28 = local_28 - fVar3;
        auVar7._0_4_ = local_38 - local_48;
        auVar7._4_4_ = fStack_34 - fStack_44;
        auVar7._8_4_ = fStack_30 - fStack_40;
        auVar7._12_4_ = fStack_2c - fStack_3c;
        uVar1 = CONCAT44(auVar7._4_4_,auVar7._0_4_);
        auVar9._0_8_ = uVar1 ^ 0x8000000080000000;
        auVar9._8_4_ = -auVar7._8_4_;
        auVar9._12_4_ = -auVar7._12_4_;
        auVar6 = maxps(auVar9,auVar7);
        fVar8 = auVar6._0_4_;
        fVar10 = auVar6._4_4_;
        auVar11._0_4_ =
             -(uint)(fVar10 < fVar8) & (uint)(fVar10 * 0.375 + fVar8) |
             ~-(uint)(fVar10 < fVar8) & (uint)(fVar8 * 0.375 + fVar10);
        auVar11._4_4_ = auVar11._0_4_;
        auVar11._8_4_ = auVar11._0_4_;
        auVar11._12_4_ = auVar11._0_4_;
        auVar6 = divps(auVar7,auVar11);
        local_48 = local_48 + fVar3 * auVar6._0_4_;
        fStack_44 = fStack_44 + fVar3 * auVar6._4_4_;
        fStack_40 = fStack_40 + fVar3 * auVar6._8_4_;
        fStack_3c = fStack_3c + fVar3 * auVar6._12_4_;
        local_50.my = fStack_44;
        local_50.mx = local_48;
        addLine(this,&local_50);
        updateActiveSegment(this);
        (this->mCurPt).mx = local_48;
        (this->mCurPt).my = fStack_44;
        fVar3 = this->mCurrentLength;
        fVar2 = local_28;
        fVar8 = local_38;
        fVar10 = fStack_34;
      } while (fVar3 < local_28);
    }
    if (fVar2 <= 0.1) goto LAB_0010c7f2;
    this->mCurrentLength = fVar3 - fVar2;
    local_50.my = fVar10;
    local_50.mx = fVar8;
    p_00 = &local_50;
  }
  addLine(this,p_00);
LAB_0010c7f2:
  if (this->mCurrentLength <= 0.1 && this->mCurrentLength != 0.1) {
    updateActiveSegment(this);
  }
  this->mCurPt = *p;
  return;
}

Assistant:

void VDasher::lineTo(const VPointF &p)
{
    VLine left, right;
    VLine line(mCurPt, p);
    float length = line.length();

    if (length <= mCurrentLength) {
        mCurrentLength -= length;
        addLine(p);
    } else {
        while (length > mCurrentLength) {
            length -= mCurrentLength;
            line.splitAtLength(mCurrentLength, left, right);

            addLine(left.p2());
            updateActiveSegment();

            line = right;
            mCurPt = line.p1();
        }
        // handle remainder
        if (length > tolerance) {
            mCurrentLength -= length;
            addLine(line.p2());
        }
    }

    if (mCurrentLength < tolerance) updateActiveSegment();

    mCurPt = p;
}